

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fse_decompress.c
# Opt level: O3

size_t FSE_decompress_usingDTable
                 (void *dst,size_t originalSize,void *cSrc,size_t cSrcSize,FSE_DTable *dt)

{
  byte bVar1;
  ushort uVar2;
  FSE_DTable FVar3;
  FSE_DTable FVar4;
  uint uVar5;
  long lVar6;
  byte bVar7;
  undefined1 *puVar8;
  ulong uVar9;
  int iVar10;
  int iVar11;
  uint uVar12;
  undefined1 *puVar13;
  undefined1 *puVar14;
  ulong uVar15;
  ulong uVar16;
  long lVar17;
  ulong uVar18;
  ulong uVar19;
  ulong uVar20;
  ulong uVar21;
  bool bVar22;
  
  puVar8 = (undefined1 *)((long)dst + (originalSize - 3));
  if (*(short *)((long)dt + 2) == 0) {
    if (cSrcSize == 0) {
      return 0xffffffffffffffb8;
    }
    if (cSrcSize < 8) {
      uVar15 = (ulong)*cSrc;
      switch(cSrcSize) {
      case 7:
        uVar15 = uVar15 | (ulong)*(byte *)((long)cSrc + 6) << 0x30;
      case 6:
        uVar15 = uVar15 + ((ulong)*(byte *)((long)cSrc + 5) << 0x28);
      case 5:
        uVar15 = uVar15 + ((ulong)*(byte *)((long)cSrc + 4) << 0x20);
      case 4:
        uVar15 = uVar15 + (ulong)*(byte *)((long)cSrc + 3) * 0x1000000;
      case 3:
        uVar15 = uVar15 + (ulong)*(byte *)((long)cSrc + 2) * 0x10000;
      case 2:
        uVar15 = uVar15 + (ulong)*(byte *)((long)cSrc + 1) * 0x100;
      }
      bVar7 = *(byte *)((long)cSrc + (cSrcSize - 1));
      if (bVar7 == 0) {
        return 0xffffffffffffffec;
      }
      uVar12 = 0x1f;
      if (bVar7 != 0) {
        for (; bVar7 >> uVar12 == 0; uVar12 = uVar12 - 1) {
        }
      }
      iVar11 = (uVar12 ^ 0x1f) + (int)cSrcSize * -8 + 0x29;
      lVar6 = 0;
    }
    else {
      bVar7 = *(byte *)((long)cSrc + (cSrcSize - 1));
      if (bVar7 == 0) {
        return 0xffffffffffffffff;
      }
      if (0xffffffffffffff88 < cSrcSize) {
        return cSrcSize;
      }
      uVar15 = *(ulong *)((long)cSrc + (cSrcSize - 8));
      lVar6 = cSrcSize - 8;
      uVar12 = 0x1f;
      if (bVar7 != 0) {
        for (; bVar7 >> uVar12 == 0; uVar12 = uVar12 - 1) {
        }
      }
      iVar11 = ~uVar12 + 9;
    }
    uVar2 = (ushort)*dt;
    bVar7 = 0x3fU - (char)uVar2 & 0x3f;
    uVar19 = ((uVar15 << ((byte)iVar11 & 0x3f)) >> 1) >> bVar7;
    uVar12 = iVar11 + (uint)uVar2;
    if (uVar12 < 0x41) {
      if (lVar6 < 8) {
        if (lVar6 == 0) {
          lVar6 = 0;
          goto LAB_001829d4;
        }
        uVar5 = (uint)lVar6;
        if (cSrc <= (void *)((long)cSrc + (lVar6 - (ulong)(uVar12 >> 3)))) {
          uVar5 = uVar12 >> 3;
        }
        uVar12 = uVar12 + uVar5 * -8;
      }
      else {
        uVar5 = uVar12 >> 3;
        uVar12 = uVar12 & 7;
      }
      lVar6 = lVar6 - (ulong)uVar5;
      uVar15 = *(ulong *)((long)cSrc + lVar6);
    }
LAB_001829d4:
    uVar18 = ((uVar15 << ((byte)uVar12 & 0x3f)) >> 1) >> bVar7;
    uVar12 = uVar2 + uVar12;
    if (uVar12 < 0x41) {
      if (lVar6 < 8) {
        if (lVar6 == 0) {
          lVar6 = 0;
          goto LAB_00182a34;
        }
        uVar5 = (uint)lVar6;
        if (cSrc <= (void *)((long)cSrc + (lVar6 - (ulong)(uVar12 >> 3)))) {
          uVar5 = uVar12 >> 3;
        }
        uVar12 = uVar12 + uVar5 * -8;
      }
      else {
        uVar5 = uVar12 >> 3;
        uVar12 = uVar12 & 7;
      }
      lVar6 = lVar6 - (ulong)uVar5;
      uVar15 = *(ulong *)((long)cSrc + lVar6);
    }
LAB_00182a34:
    puVar14 = (undefined1 *)dst;
    if (uVar12 < 0x41) {
      do {
        if (lVar6 < 8) {
          if (lVar6 == 0) {
            lVar6 = 0;
            break;
          }
          uVar5 = uVar12 >> 3;
          bVar22 = cSrc <= (void *)((long)cSrc + (lVar6 - (ulong)uVar5));
          if (!bVar22) {
            uVar5 = (uint)lVar6;
          }
          uVar12 = uVar12 + uVar5 * -8;
        }
        else {
          uVar5 = uVar12 >> 3;
          uVar12 = uVar12 & 7;
          bVar22 = true;
        }
        lVar6 = lVar6 - (ulong)uVar5;
        uVar15 = *(ulong *)((long)cSrc + lVar6);
        if ((puVar8 <= puVar14) || (!bVar22)) break;
        uVar20 = (ulong)(ushort)dt[uVar19 + 1];
        bVar7 = *(byte *)((long)dt + uVar19 * 4 + 7);
        uVar16 = ((uVar15 << ((byte)uVar12 & 0x3f)) >> 1) >> (0x3f - bVar7 & 0x3f);
        iVar11 = uVar12 + bVar7;
        *puVar14 = *(undefined1 *)((long)dt + uVar19 * 4 + 6);
        bVar7 = *(byte *)((long)dt + uVar18 * 4 + 7);
        uVar21 = ((uVar15 << ((byte)iVar11 & 0x3f)) >> 1) >> (0x3f - bVar7 & 0x3f);
        uVar9 = (ulong)(ushort)dt[uVar18 + 1];
        iVar11 = iVar11 + (uint)bVar7;
        puVar14[1] = *(undefined1 *)((long)dt + uVar18 * 4 + 6);
        lVar17 = uVar16 * 4;
        bVar7 = *(byte *)((long)dt + uVar20 * 4 + lVar17 + 7);
        uVar19 = (((uVar15 << ((byte)iVar11 & 0x3f)) >> 1) >> (0x3f - bVar7 & 0x3f)) +
                 (ulong)(ushort)dt[uVar16 + uVar20 + 1];
        iVar11 = iVar11 + (uint)bVar7;
        puVar14[2] = *(undefined1 *)((long)dt + uVar20 * 4 + lVar17 + 6);
        lVar17 = uVar21 * 4;
        bVar7 = *(byte *)((long)dt + uVar9 * 4 + lVar17 + 7);
        uVar18 = (((uVar15 << ((byte)iVar11 & 0x3f)) >> 1) >> (0x3f - bVar7 & 0x3f)) +
                 (ulong)(ushort)dt[uVar21 + uVar9 + 1];
        uVar12 = iVar11 + (uint)bVar7;
        puVar14[3] = *(undefined1 *)((long)dt + uVar9 * 4 + lVar17 + 6);
        puVar14 = puVar14 + 4;
        if (0x40 < uVar12) break;
      } while( true );
    }
    puVar8 = (undefined1 *)((long)dst + (originalSize - 2));
    if (puVar8 < puVar14) {
      return 0xffffffffffffffba;
    }
    lVar17 = (long)puVar14 - (long)dst;
    puVar14 = puVar14 + 1;
    do {
      FVar3 = dt[uVar19 + 1];
      bVar7 = *(byte *)((long)dt + uVar19 * 4 + 7);
      uVar20 = uVar15 << ((byte)uVar12 & 0x3f);
      uVar12 = uVar12 + bVar7;
      puVar14[-1] = *(undefined1 *)((long)dt + uVar19 * 4 + 6);
      if (0x40 < uVar12) {
        lVar6 = 2;
        goto LAB_00182e58;
      }
      if (lVar6 < 8) {
        if (lVar6 != 0) {
          uVar5 = (uint)lVar6;
          if (cSrc <= (void *)((long)cSrc + (lVar6 - (ulong)(uVar12 >> 3)))) {
            uVar5 = uVar12 >> 3;
          }
          uVar12 = uVar12 + uVar5 * -8;
          goto LAB_00182d99;
        }
        lVar6 = 0;
      }
      else {
        uVar5 = uVar12 >> 3;
        uVar12 = uVar12 & 7;
LAB_00182d99:
        lVar6 = lVar6 - (ulong)uVar5;
        uVar15 = *(ulong *)((long)cSrc + lVar6);
      }
      if (puVar8 < puVar14) {
        return 0xffffffffffffffba;
      }
      FVar4 = dt[uVar18 + 1];
      bVar1 = *(byte *)((long)dt + uVar18 * 4 + 7);
      uVar9 = uVar15 << ((byte)uVar12 & 0x3f);
      uVar19 = ((uVar20 >> 1) >> (0x3f - bVar7 & 0x3f)) + (ulong)(ushort)FVar3;
      uVar12 = uVar12 + bVar1;
      *puVar14 = *(undefined1 *)((long)dt + uVar18 * 4 + 6);
      if (0x40 < uVar12) {
        puVar14 = puVar14 + 1;
        lVar6 = 3;
        uVar18 = uVar19;
LAB_00182e58:
        *puVar14 = *(undefined1 *)((long)dt + uVar18 * 4 + 6);
        return lVar6 + lVar17;
      }
      if (lVar6 < 8) {
        if (lVar6 != 0) {
          uVar5 = (uint)lVar6;
          if (cSrc <= (void *)((long)cSrc + (lVar6 - (ulong)(uVar12 >> 3)))) {
            uVar5 = uVar12 >> 3;
          }
          uVar12 = uVar12 + uVar5 * -8;
          goto LAB_00182e14;
        }
        lVar6 = 0;
      }
      else {
        uVar5 = uVar12 >> 3;
        uVar12 = uVar12 & 7;
LAB_00182e14:
        lVar6 = lVar6 - (ulong)uVar5;
        uVar15 = *(ulong *)((long)cSrc + lVar6);
      }
      uVar18 = ((uVar9 >> 1) >> (0x3f - bVar1 & 0x3f)) + (ulong)(ushort)FVar4;
      lVar17 = lVar17 + 2;
      puVar13 = puVar14 + 1;
      puVar14 = puVar14 + 2;
      if (puVar8 < puVar13) {
        return 0xffffffffffffffba;
      }
    } while( true );
  }
  if (cSrcSize == 0) {
    return 0xffffffffffffffb8;
  }
  if (cSrcSize < 8) {
    uVar15 = (ulong)*cSrc;
    switch(cSrcSize) {
    case 7:
      uVar15 = uVar15 | (ulong)*(byte *)((long)cSrc + 6) << 0x30;
    case 6:
      uVar15 = uVar15 + ((ulong)*(byte *)((long)cSrc + 5) << 0x28);
    case 5:
      uVar15 = uVar15 + ((ulong)*(byte *)((long)cSrc + 4) << 0x20);
    case 4:
      uVar15 = uVar15 + (ulong)*(byte *)((long)cSrc + 3) * 0x1000000;
    case 3:
      uVar15 = uVar15 + (ulong)*(byte *)((long)cSrc + 2) * 0x10000;
    case 2:
      uVar15 = uVar15 + (ulong)*(byte *)((long)cSrc + 1) * 0x100;
    }
    bVar7 = *(byte *)((long)cSrc + (cSrcSize - 1));
    if (bVar7 == 0) {
      return 0xffffffffffffffec;
    }
    uVar12 = 0x1f;
    if (bVar7 != 0) {
      for (; bVar7 >> uVar12 == 0; uVar12 = uVar12 - 1) {
      }
    }
    iVar11 = (uVar12 ^ 0x1f) + (int)cSrcSize * -8 + 0x29;
    lVar6 = 0;
  }
  else {
    bVar7 = *(byte *)((long)cSrc + (cSrcSize - 1));
    if (bVar7 == 0) {
      return 0xffffffffffffffff;
    }
    if (0xffffffffffffff88 < cSrcSize) {
      return cSrcSize;
    }
    uVar15 = *(ulong *)((long)cSrc + (cSrcSize - 8));
    lVar6 = cSrcSize - 8;
    uVar12 = 0x1f;
    if (bVar7 != 0) {
      for (; bVar7 >> uVar12 == 0; uVar12 = uVar12 - 1) {
      }
    }
    iVar11 = ~uVar12 + 9;
  }
  uVar2 = (ushort)*dt;
  bVar7 = 0x3fU - (char)uVar2 & 0x3f;
  uVar19 = ((uVar15 << ((byte)iVar11 & 0x3f)) >> 1) >> bVar7;
  uVar12 = iVar11 + (uint)uVar2;
  if (uVar12 < 0x41) {
    if (lVar6 < 8) {
      if (lVar6 == 0) {
        lVar6 = 0;
        goto LAB_00182856;
      }
      uVar5 = (uint)lVar6;
      if (cSrc <= (void *)((long)cSrc + (lVar6 - (ulong)(uVar12 >> 3)))) {
        uVar5 = uVar12 >> 3;
      }
      uVar12 = uVar12 + uVar5 * -8;
    }
    else {
      uVar5 = uVar12 >> 3;
      uVar12 = uVar12 & 7;
    }
    lVar6 = lVar6 - (ulong)uVar5;
    uVar15 = *(ulong *)((long)cSrc + lVar6);
  }
LAB_00182856:
  uVar18 = ((uVar15 << ((byte)uVar12 & 0x3f)) >> 1) >> bVar7;
  uVar12 = uVar2 + uVar12;
  puVar14 = (undefined1 *)dst;
  if (uVar12 < 0x41) {
    if (lVar6 < 8) {
      if (lVar6 == 0) {
        lVar6 = 0;
        goto LAB_001828bd;
      }
      uVar5 = (uint)lVar6;
      if (cSrc <= (void *)((long)cSrc + (lVar6 - (ulong)(uVar12 >> 3)))) {
        uVar5 = uVar12 >> 3;
      }
      uVar12 = uVar12 + uVar5 * -8;
    }
    else {
      uVar5 = uVar12 >> 3;
      uVar12 = uVar12 & 7;
    }
    lVar6 = lVar6 - (ulong)uVar5;
    uVar15 = *(ulong *)((long)cSrc + lVar6);
  }
LAB_001828bd:
  while (uVar12 < 0x41) {
    if (lVar6 < 8) {
      if (lVar6 == 0) {
        lVar6 = 0;
        break;
      }
      uVar5 = uVar12 >> 3;
      bVar22 = cSrc <= (void *)((long)cSrc + (lVar6 - (ulong)uVar5));
      if (!bVar22) {
        uVar5 = (uint)lVar6;
      }
      uVar12 = uVar12 + uVar5 * -8;
    }
    else {
      uVar5 = uVar12 >> 3;
      uVar12 = uVar12 & 7;
      bVar22 = true;
    }
    lVar6 = lVar6 - (ulong)uVar5;
    uVar15 = *(ulong *)((long)cSrc + lVar6);
    if ((puVar8 <= puVar14) || (!bVar22)) break;
    uVar20 = (ulong)(ushort)dt[uVar19 + 1];
    bVar7 = *(byte *)((long)dt + uVar19 * 4 + 7);
    iVar11 = uVar12 + bVar7;
    uVar21 = (uVar15 << ((byte)uVar12 & 0x3f)) >> (-bVar7 & 0x3f);
    *puVar14 = *(undefined1 *)((long)dt + uVar19 * 4 + 6);
    uVar16 = (ulong)(ushort)dt[uVar18 + 1];
    bVar7 = *(byte *)((long)dt + uVar18 * 4 + 7);
    iVar10 = iVar11 + (uint)bVar7;
    uVar9 = (uVar15 << ((byte)iVar11 & 0x3f)) >> (-bVar7 & 0x3f);
    puVar14[1] = *(undefined1 *)((long)dt + uVar18 * 4 + 6);
    lVar17 = uVar21 * 4;
    bVar7 = *(byte *)((long)dt + uVar20 * 4 + lVar17 + 7);
    iVar11 = iVar10 + (uint)bVar7;
    uVar19 = ((uVar15 << ((byte)iVar10 & 0x3f)) >> (-bVar7 & 0x3f)) +
             (ulong)(ushort)dt[uVar21 + uVar20 + 1];
    puVar14[2] = *(undefined1 *)((long)dt + uVar20 * 4 + lVar17 + 6);
    lVar17 = uVar9 * 4;
    bVar7 = *(byte *)((long)dt + uVar16 * 4 + lVar17 + 7);
    uVar18 = ((uVar15 << ((byte)iVar11 & 0x3f)) >> (-bVar7 & 0x3f)) +
             (ulong)(ushort)dt[uVar9 + uVar16 + 1];
    puVar14[3] = *(undefined1 *)((long)dt + uVar16 * 4 + lVar17 + 6);
    puVar14 = puVar14 + 4;
    uVar12 = iVar11 + (uint)bVar7;
  }
  puVar8 = (undefined1 *)((long)dst + (originalSize - 2));
  if (puVar8 < puVar14) {
    return 0xffffffffffffffba;
  }
  lVar17 = (long)puVar14 - (long)dst;
  puVar14 = puVar14 + 1;
  do {
    FVar3 = dt[uVar19 + 1];
    bVar7 = *(byte *)((long)dt + uVar19 * 4 + 7);
    uVar20 = uVar15 << ((byte)uVar12 & 0x3f);
    uVar12 = uVar12 + bVar7;
    puVar14[-1] = *(undefined1 *)((long)dt + uVar19 * 4 + 6);
    if (0x40 < uVar12) {
      lVar6 = 2;
      goto LAB_00182cdd;
    }
    if (lVar6 < 8) {
      if (lVar6 != 0) {
        uVar5 = (uint)lVar6;
        if (cSrc <= (void *)((long)cSrc + (lVar6 - (ulong)(uVar12 >> 3)))) {
          uVar5 = uVar12 >> 3;
        }
        uVar12 = uVar12 + uVar5 * -8;
        goto LAB_00182c1c;
      }
      lVar6 = 0;
    }
    else {
      uVar5 = uVar12 >> 3;
      uVar12 = uVar12 & 7;
LAB_00182c1c:
      lVar6 = lVar6 - (ulong)uVar5;
      uVar15 = *(ulong *)((long)cSrc + lVar6);
    }
    if (puVar8 < puVar14) {
      return 0xffffffffffffffba;
    }
    FVar4 = dt[uVar18 + 1];
    bVar1 = *(byte *)((long)dt + uVar18 * 4 + 7);
    uVar9 = uVar15 << ((byte)uVar12 & 0x3f);
    uVar12 = uVar12 + bVar1;
    uVar19 = (uVar20 >> (-bVar7 & 0x3f)) + (ulong)(ushort)FVar3;
    *puVar14 = *(undefined1 *)((long)dt + uVar18 * 4 + 6);
    if (0x40 < uVar12) {
      puVar14 = puVar14 + 1;
      lVar6 = 3;
      uVar18 = uVar19;
LAB_00182cdd:
      *puVar14 = *(undefined1 *)((long)dt + uVar18 * 4 + 6);
      return lVar6 + lVar17;
    }
    if (lVar6 < 8) {
      if (lVar6 != 0) {
        uVar5 = (uint)lVar6;
        if (cSrc <= (void *)((long)cSrc + (lVar6 - (ulong)(uVar12 >> 3)))) {
          uVar5 = uVar12 >> 3;
        }
        uVar12 = uVar12 + uVar5 * -8;
        goto LAB_00182c98;
      }
      lVar6 = 0;
    }
    else {
      uVar5 = uVar12 >> 3;
      uVar12 = uVar12 & 7;
LAB_00182c98:
      lVar6 = lVar6 - (ulong)uVar5;
      uVar15 = *(ulong *)((long)cSrc + lVar6);
    }
    uVar18 = (uVar9 >> (-bVar1 & 0x3f)) + (ulong)(ushort)FVar4;
    lVar17 = lVar17 + 2;
    puVar13 = puVar14 + 1;
    puVar14 = puVar14 + 2;
    if (puVar8 < puVar13) {
      return 0xffffffffffffffba;
    }
  } while( true );
}

Assistant:

size_t FSE_decompress_usingDTable(void* dst, size_t originalSize,
                            const void* cSrc, size_t cSrcSize,
                            const FSE_DTable* dt)
{
    const void* ptr = dt;
    const FSE_DTableHeader* DTableH = (const FSE_DTableHeader*)ptr;
    const U32 fastMode = DTableH->fastMode;

    /* select fast mode (static) */
    if (fastMode) return FSE_decompress_usingDTable_generic(dst, originalSize, cSrc, cSrcSize, dt, 1);
    return FSE_decompress_usingDTable_generic(dst, originalSize, cSrc, cSrcSize, dt, 0);
}